

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thinker.h
# Opt level: O0

void __thiscall Jupiter::Thinker::Thinker(Thinker *this)

{
  Thinker *this_local;
  
  this->_vptr_Thinker = (_func_int **)&PTR___cxa_pure_virtual_00157d08;
  return;
}

Assistant:

class JUPITER_API Thinker
	{
	public:
		/**
		* @brief Makes an object think. Should return 0 if no error occurs.
		*
		* @return Error number.
		*/
		virtual int think() = 0;

		/**
		* @brief Virtual destructor for the "Thinker" interface. Does nothing.
		*/
		virtual ~Thinker() {}
	}